

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O3

span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL> __thiscall
slang::ast::RandSeqProductionSymbol::getRules(RandSeqProductionSymbol *this)

{
  SyntaxNode *this_00;
  int iVar1;
  ProductionSyntax *pPVar2;
  RsRuleSyntax *syntax;
  undefined4 extraout_var;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *src;
  size_type extraout_RDX_01;
  ulong uVar3;
  specific_symbol_iterator<slang::ast::StatementBlockSymbol> sVar4;
  size_t index;
  specific_symbol_iterator<slang::ast::StatementBlockSymbol> tmp;
  specific_symbol_iterator<slang::ast::StatementBlockSymbol> ruleBlock;
  iterator_range<slang::ast::Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>_>
  iVar5;
  SmallVector<slang::ast::RandSeqProductionSymbol::Rule,_8UL> buffer;
  specific_symbol_iterator<slang::ast::StatementBlockSymbol> local_310;
  ASTContext local_308;
  Rule local_2d0;
  SmallVectorBase<slang::ast::RandSeqProductionSymbol::Rule> local_288 [6];
  
  if ((this->rules).
      super__Optional_base<nonstd::span_lite::span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL>,_true,_true>
      ._M_payload.
      super__Optional_payload_base<nonstd::span_lite::span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL>_>
      ._M_engaged == false) {
    this_00 = (this->super_Symbol).originatingSyntax;
    if (this_00 == (SyntaxNode *)0x0) {
      assert::assertFailed
                ("syntax",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/MemberSymbols.cpp"
                 ,0x53f,
                 "span<const RandSeqProductionSymbol::Rule> slang::ast::RandSeqProductionSymbol::getRules() const"
                );
    }
    local_308.scope.ptr = &this->super_Scope;
    local_308.lookupIndex = 0xffffffff;
    local_308.flags.m_bits = 0;
    local_308.instanceOrProc = (Symbol *)0x0;
    local_308.firstTempVar = (TempVarSymbol *)0x0;
    local_308.randomizeDetails = (RandomizeDetails *)0x0;
    local_308.assertionInstance = (AssertionInstanceDetails *)0x0;
    iVar5 = Scope::membersOfType<slang::ast::StatementBlockSymbol>(local_308.scope.ptr);
    local_288[0].data_ = (pointer)local_288[0].firstElement;
    local_288[0].len = 0;
    local_288[0].cap = 8;
    pPVar2 = slang::syntax::SyntaxNode::as<slang::syntax::ProductionSyntax>(this_00);
    uVar3 = (pPVar2->rules).elements.size_ + 1;
    src = extraout_RDX;
    if (1 < uVar3) {
      index = 0;
      do {
        local_310 = iVar5.m_end.current;
        ruleBlock = iVar5.m_begin.current;
        syntax = slang::syntax::SeparatedSyntaxList<slang::syntax::RsRuleSyntax>::operator[]
                           (&pPVar2->rules,index);
        if (ruleBlock.current == local_310.current) {
          assert::assertFailed
                    ("blockIt != blocks.end()",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/MemberSymbols.cpp"
                     ,0x548,
                     "span<const RandSeqProductionSymbol::Rule> slang::ast::RandSeqProductionSymbol::getRules() const"
                    );
        }
        for (sVar4.current = (ruleBlock.current)->nextInScope; sVar4.current != (Symbol *)0x0;
            sVar4.current = (sVar4.current)->nextInScope) {
          if ((sVar4.current)->kind == StatementBlock) goto LAB_001cf9dc;
        }
        sVar4.current = (Symbol *)0x0;
LAB_001cf9dc:
        iVar5.m_end.current = local_310.current;
        iVar5.m_begin.current = sVar4.current;
        if (((Symbol *)&(ruleBlock.current)->kind)->kind != StatementBlock) {
          assert::assertFailed
                    ("T::isKind(kind)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/Symbol.h"
                     ,0xc4,
                     "decltype(auto) slang::ast::Symbol::as() [T = slang::ast::StatementBlockSymbol]"
                    );
        }
        createRule(&local_2d0,syntax,&local_308,(StatementBlockSymbol *)ruleBlock.current);
        SmallVectorBase<slang::ast::RandSeqProductionSymbol::Rule>::
        emplace_back<slang::ast::RandSeqProductionSymbol::Rule>(local_288,&local_2d0);
        index = index + 1;
        src = extraout_RDX_00;
      } while (index != uVar3 >> 1);
    }
    if (local_308.scope.ptr == (Scope *)0x0) {
      assert::assertFailed
                ("ptr",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                 ,0x26,
                 "T slang::not_null<const slang::ast::Scope *>::get() const [T = const slang::ast::Scope *]"
                );
    }
    iVar1 = SmallVectorBase<slang::ast::RandSeqProductionSymbol::Rule>::copy
                      (local_288,(EVP_PKEY_CTX *)(local_308.scope.ptr)->compilation,src);
    if ((this->rules).
        super__Optional_base<nonstd::span_lite::span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL>,_true,_true>
        ._M_payload.
        super__Optional_payload_base<nonstd::span_lite::span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL>_>
        ._M_engaged == false) {
      (this->rules).
      super__Optional_base<nonstd::span_lite::span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL>,_true,_true>
      ._M_payload.
      super__Optional_payload_base<nonstd::span_lite::span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL>_>
      ._M_engaged = true;
    }
    (this->rules).
    super__Optional_base<nonstd::span_lite::span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL>,_true,_true>
    ._M_payload.
    super__Optional_payload_base<nonstd::span_lite::span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL>_>
    ._M_payload._M_value.data_ = (pointer)CONCAT44(extraout_var,iVar1);
    (this->rules).
    super__Optional_base<nonstd::span_lite::span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL>,_true,_true>
    ._M_payload.
    super__Optional_payload_base<nonstd::span_lite::span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL>_>
    ._M_payload._M_value.size_ = extraout_RDX_01;
    if (local_288[0].data_ != (pointer)local_288[0].firstElement) {
      free(local_288[0].data_);
    }
  }
  return (this->rules).
         super__Optional_base<nonstd::span_lite::span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL>,_true,_true>
         ._M_payload.
         super__Optional_payload_base<nonstd::span_lite::span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL>_>
         ._M_payload._M_value;
}

Assistant:

span<const RandSeqProductionSymbol::Rule> RandSeqProductionSymbol::getRules() const {
    if (!rules) {
        auto syntax = getSyntax();
        ASSERT(syntax);

        ASTContext context(*this, LookupLocation::max);

        auto blocks = membersOfType<StatementBlockSymbol>();
        auto blockIt = blocks.begin();

        SmallVector<Rule, 8> buffer;
        for (auto rule : syntax->as<ProductionSyntax>().rules) {
            ASSERT(blockIt != blocks.end());
            buffer.push_back(createRule(*rule, context, *blockIt++));
        }

        rules = buffer.copy(context.getCompilation());
    }
    return *rules;
}